

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

_Bool move_next(hdr_iter *iter)

{
  _Bool _Var1;
  int32_t bucket_index_00;
  int32_t sub_bucket_index_00;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t size_of_equivalent_value_range;
  int64_t leq;
  int32_t sub_bucket_index;
  int32_t bucket_index;
  int64_t value;
  hdr_iter *iter_local;
  
  iter->counts_index = iter->counts_index + 1;
  _Var1 = has_buckets(iter);
  if (_Var1) {
    iVar2 = counts_get_normalised(iter->h,iter->counts_index);
    iter->count = iVar2;
    iter->cumulative_count = iter->count + iter->cumulative_count;
    iVar2 = hdr_value_at_index(iter->h,iter->counts_index);
    bucket_index_00 = get_bucket_index(iter->h,iVar2);
    sub_bucket_index_00 = get_sub_bucket_index(iVar2,bucket_index_00,iter->h->unit_magnitude);
    iVar3 = lowest_equivalent_value_given_bucket_indices
                      (iter->h,bucket_index_00,sub_bucket_index_00);
    iVar4 = size_of_equivalent_value_range_given_bucket_indices
                      (iter->h,bucket_index_00,sub_bucket_index_00);
    iter->lowest_equivalent_value = iVar3;
    iter->value = iVar2;
    iter->highest_equivalent_value = iVar3 + iVar4 + -1;
    iter->median_equivalent_value = iVar3 + (iVar4 >> 1);
  }
  return _Var1;
}

Assistant:

static bool move_next(struct hdr_iter* iter)
{
    iter->counts_index++;

    if (!has_buckets(iter))
    {
        return false;
    }

    iter->count = counts_get_normalised(iter->h, iter->counts_index);
    iter->cumulative_count += iter->count;
    const int64_t value = hdr_value_at_index(iter->h, iter->counts_index);
    const int32_t bucket_index = get_bucket_index(iter->h, value);
    const int32_t sub_bucket_index = get_sub_bucket_index(value, bucket_index, iter->h->unit_magnitude);
    const int64_t leq = lowest_equivalent_value_given_bucket_indices(iter->h, bucket_index, sub_bucket_index);
    const int64_t size_of_equivalent_value_range = size_of_equivalent_value_range_given_bucket_indices(
        iter->h, bucket_index, sub_bucket_index);
    iter->lowest_equivalent_value = leq;
    iter->value = value;
    iter->highest_equivalent_value = leq + size_of_equivalent_value_range - 1;
    iter->median_equivalent_value = leq + (size_of_equivalent_value_range >> 1);

    return true;
}